

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::TooShort(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,Ch *str,SizeType length,SizeType expected)

{
  CrtAllocator *allocator;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *actual;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *expected_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_40;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_30;
  SizeType local_20;
  SizeType local_1c;
  SizeType expected_local;
  SizeType length_local;
  Ch *str_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_20 = expected;
  local_1c = length;
  _expected_local = str;
  str_local = (Ch *)this;
  allocator = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_30,str,length,allocator);
  actual = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_30);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_40,local_20);
  expected_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_40);
  AddNumberError(this,kValidateErrorMinLength,actual,expected_00,(_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_40);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_30);
  return;
}

Assistant:

void TooShort(const Ch* str, SizeType length, SizeType expected) {
        AddNumberError(kValidateErrorMinLength,
            ValueType(str, length, GetStateAllocator()).Move(), SValue(expected).Move());
    }